

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O2

void __thiscall QtMWidgets::ScrollAreaPrivate::updateWidgetPosition(ScrollAreaPrivate *this)

{
  uint uVar1;
  uint uVar2;
  Int IVar3;
  QObject *pQVar4;
  long lVar5;
  long lVar6;
  LayoutDirection LVar7;
  QSize QVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int ax;
  QWidget *this_00;
  QRect local_50;
  QSize local_40;
  int local_38;
  int local_34;
  
  LVar7 = QWidget::layoutDirection();
  local_50 = QWidget::rect((this->super_AbstractScrollAreaPrivate).viewport);
  uVar1 = (this->super_AbstractScrollAreaPrivate).topLeftCorner.xp;
  uVar2 = (this->super_AbstractScrollAreaPrivate).topLeftCorner.yp;
  QVar8 = QWidget::size((QWidget *)(this->widget).wp.value);
  local_38 = ~uVar1 + QVar8.wd;
  local_40.ht = -uVar2;
  local_40.wd = -uVar1;
  local_34 = ~uVar2 + QVar8.ht;
  uVar9 = QStyle::visualRect(LVar7,&local_50,(QRect *)&local_40);
  IVar3 = (this->alignment).i;
  local_40 = QWidget::size((QWidget *)(this->widget).wp.value);
  local_50 = QWidget::rect((this->super_AbstractScrollAreaPrivate).viewport);
  uVar10 = QStyle::alignedRect(LVar7,IVar3,&local_40,&local_50);
  pQVar4 = (this->widget).wp.value;
  this_00 = (QWidget *)0x0;
  if ((((this->widget).wp.d)->strongref)._q_value.super___atomic_base<int>._M_i != 0) {
    this_00 = (QWidget *)pQVar4;
  }
  lVar5 = *(long *)(pQVar4 + 0x20);
  lVar6 = *(long *)((this->super_AbstractScrollAreaPrivate).viewport + 0x20);
  ax = (int)uVar9;
  if ((*(int *)(lVar5 + 0x1c) - *(int *)(lVar5 + 0x14)) + 1 <
      (*(int *)(lVar6 + 0x1c) - *(int *)(lVar6 + 0x14)) + 1) {
    ax = (int)uVar10;
  }
  if ((*(int *)(lVar5 + 0x20) - *(int *)(lVar5 + 0x18)) + 1 <
      (*(int *)(lVar6 + 0x20) - *(int *)(lVar6 + 0x18)) + 1) {
    uVar9 = uVar10;
  }
  QWidget::move(this_00,ax,(int)((ulong)uVar9 >> 0x20));
  return;
}

Assistant:

void
ScrollAreaPrivate::updateWidgetPosition()
{
	ScrollArea * q = q_func();

	const Qt::LayoutDirection dir = q->layoutDirection();

	const QRect scrolled = QStyle::visualRect( dir, viewport->rect(),
		QRect( QPoint( -topLeftCorner.x(), -topLeftCorner.y() ), widget->size() ) );
	const QRect aligned = QStyle::alignedRect( dir, alignment, widget->size(),
		viewport->rect() );

	widget->move( widget->width() < viewport->width() ? aligned.x() : scrolled.x(),
		widget->height() < viewport->height() ? aligned.y() : scrolled.y() );
}